

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNBase::SetPrescaler(OPNBase *this,uint p)

{
  uint ratio_00;
  uint clock;
  int local_20;
  int i;
  uint ratio;
  uint fmclock;
  uint p_local;
  OPNBase *this_local;
  
  if (this->prescale != p) {
    this->prescale = (uint8)p;
    if (2 < this->prescale) {
      __assert_fail("prescale < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/np2/fmgen_opna.cpp"
                    ,0x78,"void FM::OPNBase::SetPrescaler(uint)");
    }
    clock = (uint)(((ulong)this->clock / (ulong)(uint)(int)SetPrescaler::table[p][0]) / 0xc);
    this->rate = this->psgrate;
    if (0xffffff < clock) {
      __assert_fail("fmclock < (0x80000000 >> FM_RATIOBITS)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/np2/fmgen_opna.cpp"
                    ,0x7f,"void FM::OPNBase::SetPrescaler(uint)");
    }
    ratio_00 = (clock * 0x80 + (this->rate >> 1)) / this->rate;
    Timer::SetTimerBase(&this->super_Timer,clock);
    Chip::SetRatio(&this->chip,ratio_00);
    PSG::SetClock(&this->psg,this->clock / (uint)(int)SetPrescaler::table[p][1],this->psgrate);
    for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
      *(uint *)(lfotable + (long)local_20 * 4) = (ratio_00 << 9) / (uint)"lMGC>,\b\x05"[local_20];
    }
  }
  return;
}

Assistant:

void OPNBase::SetPrescaler(uint p)
{
	static const char table[3][2] = { { 6, 4 }, { 3, 2 }, { 2, 1 } };
	static const uint8 table2[8] = { 108,  77,  71,  67,  62,  44,  8,  5 };
	// 512
	if (prescale != p)
	{
		prescale = p;
		/*warning: comparison is always true due to limited range of data type [-Wtype-limits]*/
		// assert(0 <= prescale && prescale < 3);
		assert(prescale < 3);

		uint fmclock = clock / table[p][0] / 12;

		rate = psgrate;

		// �������g���Əo�͎��g���̔�
		assert(fmclock < (0x80000000 >> FM_RATIOBITS));
		uint ratio = ((fmclock << FM_RATIOBITS) + rate/2) / rate;

		SetTimerBase(fmclock);
//		MakeTimeTable(ratio);
		chip.SetRatio(ratio);
		psg.SetClock(clock / table[p][1], psgrate);

		for (int i=0; i<8; i++)
		{
			lfotable[i] = (ratio << (2+FM_LFOCBITS-FM_RATIOBITS)) / table2[i];
		}
	}
}